

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O3

Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *
gimage::cropImage<unsigned_short>
          (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *__return_storage_ptr__,
          Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image,long x,long y,long w,
          long h)

{
  unsigned_short ***pppuVar1;
  long lVar2;
  unsigned_short ***pppuVar3;
  unsigned_short uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  unsigned_short *puVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  lVar6 = 0;
  if (0 < w) {
    lVar6 = w;
  }
  lVar7 = 0;
  if (0 < h) {
    lVar7 = h;
  }
  iVar5 = image->depth;
  __return_storage_ptr__->depth = 0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->pixel = (unsigned_short *)0x0;
  __return_storage_ptr__->row = (unsigned_short **)0x0;
  __return_storage_ptr__->img = (unsigned_short ***)0x0;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
            (__return_storage_ptr__,lVar6,lVar7,(long)iVar5);
  if ((((y | x) < 0) || (image->width < lVar6 + x)) || (image->height < lVar7 + y)) {
    iVar5 = image->depth;
    if (0 < (long)iVar5) {
      lVar6 = 0;
      do {
        if (0 < h) {
          pppuVar1 = __return_storage_ptr__->img;
          lVar7 = 0;
          do {
            if (0 < w) {
              lVar11 = lVar7 + y;
              lVar2 = image->width;
              pppuVar3 = image->img;
              puVar8 = pppuVar1[lVar6][lVar7];
              lVar9 = x;
              lVar10 = w;
              do {
                uVar4 = 0xffff;
                if (((-1 < lVar9) && (-1 < lVar11)) && ((lVar9 < lVar2 && (lVar11 < image->height)))
                   ) {
                  uVar4 = pppuVar3[lVar6][lVar11][lVar9];
                }
                *puVar8 = uVar4;
                lVar9 = lVar9 + 1;
                puVar8 = puVar8 + 1;
                lVar10 = lVar10 + -1;
              } while (lVar10 != 0);
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 != h);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar5);
    }
  }
  else {
    iVar5 = image->depth;
    if (0 < iVar5) {
      lVar7 = 0;
      do {
        if (0 < h) {
          lVar11 = 0;
          do {
            memcpy(__return_storage_ptr__->img[lVar7][lVar11],image->img[lVar7][y + lVar11] + x,
                   lVar6 * 2);
            lVar11 = lVar11 + 1;
          } while (h != lVar11);
          iVar5 = image->depth;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < iVar5);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Image<T> cropImage(const Image<T> &image, long x, long y, long w, long h)
{
  w=std::max(0l, w);
  h=std::max(0l, h);

  Image<T> ret(w, h, image.getDepth());

  if (x >= 0 && y >= 0 && x+w <= image.getWidth() && y+h <= image.getHeight())
  {
    for (int d=0; d<image.getDepth(); d++)
    {
      for (long k=0; k<h; k++)
      {
        memcpy(ret.getPtr(0, k, d), image.getPtr(x, y+k, d), w*sizeof(T));
      }
    }
  }
  else
  {
    for (int d=0; d<image.getDepth(); d++)
    {
      for (long k=0; k<h; k++)
      {
        for (long i=0; i<w; i++)
          ret.set(i, k, d,
                  static_cast<typename Image<T>::store_t>(image.getBoundsInv(x+i, y+k, d)));
      }
    }
  }

  return ret;
}